

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O2

t_generator *
t_generator_registry::get_generator
          (t_program *program,string *language,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *options)

{
  bool bVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
  *this;
  iterator iVar2;
  t_generator *ptVar3;
  
  this = &get_generator_map_abi_cxx11_()->_M_t;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
          ::find(this,language);
  bVar1 = std::operator==(language,"csharp");
  if (!bVar1) {
    bVar1 = std::operator==(language,"netcore");
    if (!bVar1) goto LAB_002c4209;
  }
  failure("The \'%s\' target is no longer available. Use \'netstd\' instead.",
          (language->_M_dataplus)._M_p);
LAB_002c4209:
  if ((_Rb_tree_header *)iVar2._M_node != &(this->_M_impl).super__Rb_tree_header) {
    ptVar3 = (t_generator *)
             (**(code **)(**(long **)(iVar2._M_node + 2) + 0x10))
                       (*(long **)(iVar2._M_node + 2),program,parsed_options,options);
    return ptVar3;
  }
  return (t_generator *)0x0;
}

Assistant:

t_generator* t_generator_registry::get_generator(t_program* program,
                                                 const string& language,
                                                 const map<string, string>& parsed_options,
                                                 const std::string& options) {
  gen_map_t& the_map = get_generator_map();
  gen_map_t::iterator iter = the_map.find(language);

  if ((language == "csharp") || (language == "netcore")) {
    failure("The '%s' target is no longer available. Use 'netstd' instead.", language.c_str());
  }

  if (iter == the_map.end()) {
    return nullptr;
  }

  return iter->second->get_generator(program, parsed_options, options);
}